

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
rc::detail::(anonymous_namespace)::describeIngredient_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Ingredient *ingredient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Any value;
  string description;
  ostringstream valueString;
  __uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>
  local_1e0;
  size_type *local_1d8;
  size_type local_1d0;
  size_type local_1c8;
  undefined8 uStack_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  (**(code **)**(undefined8 **)(this + 0x20))(&local_1e0);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,*(long *)this,*(long *)(this + 8) + *(long *)this);
  if (local_1b0 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    Any::showType((Any *)&local_1e0,(ostream *)local_198);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_1d8);
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  Any::showValue((Any *)&local_1e0,(ostream *)local_198);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1b8,local_1b8 + local_1b0);
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if (local_1d8 == &local_1c8) {
    paVar1->_M_allocated_capacity = local_1c8;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_1c0;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_1d8;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_1c8;
  }
  (__return_storage_ptr__->second)._M_string_length = local_1d0;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1e0._M_t.
      super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
      .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
       )0x0) {
    (*(*(_func_int ***)
        local_1e0._M_t.
        super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
        .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl)[5])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
describeIngredient(const gen::detail::Recipe::Ingredient &ingredient) {
  // TODO I don't know if this is the right approach with counterexamples
  // even...
  try {
    return tryDescribeIngredientValue(ingredient);
  } catch (const GenerationFailure &e) {
    return {"Generation failed", e.what()};
  } catch (const std::exception &e) {
    return {"Exception while generating", e.what()};
  } catch (...) {
    return {"Unknown exception", "<\?\?\?>"};
  }
}